

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock_updates.cc
# Opt level: O2

void __thiscall
tchecker::clock_updates_map_t::clock_updates_map_t(clock_updates_map_t *this,size_t clock_nb)

{
  pointer pcVar1;
  uint clock_id;
  long *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  shared_ptr<const_tchecker::expression_t> local_58;
  clock_update_t local_48;
  
  std::vector<tchecker::clock_updates_list_t,_std::allocator<tchecker::clock_updates_list_t>_>::
  vector(&this->_map,clock_nb,(allocator_type *)&local_48);
  for (clock_id = 0; clock_id < clock_nb; clock_id = clock_id + 1) {
    pcVar1 = (this->_map).
             super__Vector_base<tchecker::clock_updates_list_t,_std::allocator<tchecker::clock_updates_list_t>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::make_shared<tchecker::int_expression_t,int>((int *)&local_68);
    if (local_68 == (long *)0x0) {
      local_58.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    else {
      local_58.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)((long)local_68 + *(long *)(*local_68 + -0x38));
    }
    local_58.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Stack_60._M_pi;
    local_68 = (long *)0x0;
    _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    clock_update_t::clock_update_t(&local_48,clock_id,&local_58);
    clock_updates_list_t::set(pcVar1 + clock_id,&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_48._value.
                super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_58.
                super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_60);
  }
  return;
}

Assistant:

clock_updates_map_t::clock_updates_map_t(std::size_t clock_nb) : _map(clock_nb)
{
  for (tchecker::clock_id_t x = 0; x < clock_nb; ++x)
    _map[x].set(tchecker::clock_update_t{x, std::make_shared<tchecker::int_expression_t>(0)});
}